

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int cvLsBandDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,CVodeMem cv_mem,N_Vector tmp1,
                 N_Vector tmp2)

{
  double dVar1;
  long lVar2;
  int iVar3;
  sunindextype sVar4;
  sunindextype sVar5;
  sunindextype sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  sunrealtype *psVar13;
  long in_RCX;
  SUNMatrix in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  int retval;
  CVLsMem cvls_mem;
  sunindextype mlower;
  sunindextype mupper;
  sunindextype N;
  sunindextype i2;
  sunindextype i1;
  sunindextype ngroups;
  sunindextype width;
  sunindextype j;
  sunindextype i;
  sunindextype group;
  sunrealtype *cns_data;
  sunrealtype *ytemp_data;
  sunrealtype *y_data;
  sunrealtype *ftemp_data;
  sunrealtype *fy_data;
  sunrealtype *ewt_data;
  sunrealtype *col_j;
  sunrealtype conj;
  sunrealtype srur;
  sunrealtype inc_inv;
  sunrealtype inc;
  sunrealtype minInc;
  sunrealtype fnorm;
  N_Vector ytemp;
  N_Vector ftemp;
  long local_148;
  long local_140;
  double local_138;
  double local_130;
  long local_128;
  double local_120;
  double local_118;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  double local_60;
  
  local_b0 = 0;
  lVar2 = *(long *)(in_RCX + 0x410);
  sVar4 = SUNBandMatrix_Columns(in_RDX);
  sVar5 = SUNBandMatrix_UpperBandwidth(in_RDX);
  sVar6 = SUNBandMatrix_LowerBandwidth(in_RDX);
  lVar7 = N_VGetArrayPointer(*(undefined8 *)(in_RCX + 200));
  lVar8 = N_VGetArrayPointer(in_RSI);
  lVar9 = N_VGetArrayPointer(in_R8);
  lVar10 = N_VGetArrayPointer(in_RDI);
  lVar11 = N_VGetArrayPointer(in_R9);
  if (*(int *)(in_RCX + 0x58) != 0) {
    local_b0 = N_VGetArrayPointer(*(undefined8 *)(in_RCX + 0x108));
  }
  N_VScale(0x3ff0000000000000,in_RDI,in_R9);
  if (0.0 < *(double *)(in_RCX + 8)) {
    local_118 = sqrt(*(double *)(in_RCX + 8));
  }
  else {
    local_118 = 0.0;
  }
  local_120 = (double)N_VWrmsNorm(in_RSI,*(undefined8 *)(in_RCX + 200));
  if ((local_120 != 0.0) || (NAN(local_120))) {
    local_120 = ABS(*(double *)(in_RCX + 0x140)) * 1000.0 * *(double *)(in_RCX + 8) * (double)sVar4
                * local_120;
  }
  else {
    local_120 = 1.0;
  }
  lVar12 = sVar6 + sVar5 + 1;
  local_128 = sVar4;
  if (lVar12 < sVar4) {
    local_128 = lVar12;
  }
  local_b8 = 1;
  while( true ) {
    if (local_128 < local_b8) {
      return 0;
    }
    for (local_c8 = local_b8 + -1; local_c8 < sVar4; local_c8 = lVar12 + local_c8) {
      if (local_118 * ABS(*(double *)(lVar10 + local_c8 * 8)) <=
          local_120 / *(double *)(lVar7 + local_c8 * 8)) {
        local_130 = local_120 / *(double *)(lVar7 + local_c8 * 8);
      }
      else {
        local_130 = local_118 * ABS(*(double *)(lVar10 + local_c8 * 8));
      }
      local_60 = local_130;
      if (*(int *)(in_RCX + 0x58) != 0) {
        dVar1 = *(double *)(local_b0 + local_c8 * 8);
        if ((ABS(dVar1) != 1.0) || (NAN(ABS(dVar1)))) {
          if ((ABS(dVar1) == 2.0) &&
             ((!NAN(ABS(dVar1)) && ((*(double *)(lVar11 + local_c8 * 8) + local_130) * dVar1 <= 0.0)
              ))) {
            local_60 = -local_130;
          }
        }
        else if ((*(double *)(lVar11 + local_c8 * 8) + local_130) * dVar1 < 0.0) {
          local_60 = -local_130;
        }
      }
      *(double *)(lVar11 + local_c8 * 8) = local_60 + *(double *)(lVar11 + local_c8 * 8);
    }
    iVar3 = (**(code **)(in_RCX + 0x10))(in_XMM0_Qa,in_R9,in_R8,*(undefined8 *)(in_RCX + 0x18));
    *(long *)(lVar2 + 0x90) = *(long *)(lVar2 + 0x90) + 1;
    if (iVar3 != 0) break;
    for (local_c8 = local_b8 + -1; local_c8 < sVar4; local_c8 = lVar12 + local_c8) {
      *(undefined8 *)(lVar11 + local_c8 * 8) = *(undefined8 *)(lVar10 + local_c8 * 8);
      psVar13 = SUNBandMatrix_Column(in_RDX,local_c8);
      if (local_118 * ABS(*(double *)(lVar10 + local_c8 * 8)) <=
          local_120 / *(double *)(lVar7 + local_c8 * 8)) {
        local_138 = local_120 / *(double *)(lVar7 + local_c8 * 8);
      }
      else {
        local_138 = local_118 * ABS(*(double *)(lVar10 + local_c8 * 8));
      }
      local_60 = local_138;
      if (*(int *)(in_RCX + 0x58) != 0) {
        dVar1 = *(double *)(local_b0 + local_c8 * 8);
        if ((ABS(dVar1) != 1.0) || (NAN(ABS(dVar1)))) {
          if ((ABS(dVar1) == 2.0) &&
             ((!NAN(ABS(dVar1)) && ((*(double *)(lVar11 + local_c8 * 8) + local_138) * dVar1 <= 0.0)
              ))) {
            local_60 = -local_138;
          }
        }
        else if ((*(double *)(lVar11 + local_c8 * 8) + local_138) * dVar1 < 0.0) {
          local_60 = -local_138;
        }
      }
      if (local_c8 - sVar5 < 0) {
        local_140 = 0;
      }
      else {
        local_140 = local_c8 - sVar5;
      }
      if (local_c8 + sVar6 < sVar4 + -1) {
        local_148 = local_c8 + sVar6;
      }
      else {
        local_148 = sVar4 + -1;
      }
      for (local_c0 = local_140; local_c0 <= local_148; local_c0 = local_c0 + 1) {
        psVar13[local_c0 - local_c8] =
             (1.0 / local_60) *
             (*(double *)(lVar9 + local_c0 * 8) - *(double *)(lVar8 + local_c0 * 8));
      }
    }
    local_b8 = local_b8 + 1;
  }
  return iVar3;
}

Assistant:

int cvLsBandDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                  CVodeMem cv_mem, N_Vector tmp1, N_Vector tmp2)
{
  N_Vector ftemp, ytemp;
  sunrealtype fnorm, minInc, inc, inc_inv, srur, conj;
  sunrealtype *col_j, *ewt_data, *fy_data, *ftemp_data;
  sunrealtype *y_data, *ytemp_data, *cns_data;
  sunindextype group, i, j, width, ngroups, i1, i2;
  sunindextype N, mupper, mlower;
  CVLsMem cvls_mem;
  int retval = 0;

  /* initialize cns_data to avoid compiler warning */
  cns_data = NULL;

  /* access LsMem interface structure */
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* access matrix dimensions */
  N      = SUNBandMatrix_Columns(Jac);
  mupper = SUNBandMatrix_UpperBandwidth(Jac);
  mlower = SUNBandMatrix_LowerBandwidth(Jac);

  /* Rename work vectors for use as temporary values of y and f */
  ftemp = tmp1;
  ytemp = tmp2;

  /* Obtain pointers to the data for ewt, fy, ftemp, y, ytemp */
  ewt_data   = N_VGetArrayPointer(cv_mem->cv_ewt);
  fy_data    = N_VGetArrayPointer(fy);
  ftemp_data = N_VGetArrayPointer(ftemp);
  y_data     = N_VGetArrayPointer(y);
  ytemp_data = N_VGetArrayPointer(ytemp);
  if (cv_mem->cv_constraintsSet)
  {
    cns_data = N_VGetArrayPointer(cv_mem->cv_constraints);
  }

  /* Load ytemp with y = predicted y vector */
  N_VScale(ONE, y, ytemp);

  /* Set minimum increment based on uround and norm of f */
  srur   = SUNRsqrt(cv_mem->cv_uround);
  fnorm  = N_VWrmsNorm(fy, cv_mem->cv_ewt);
  minInc = (fnorm != ZERO) ? (MIN_INC_MULT * SUNRabs(cv_mem->cv_h) *
                              cv_mem->cv_uround * N * fnorm)
                           : ONE;

  /* Set bandwidth and number of column groups for band differencing */
  width   = mlower + mupper + 1;
  ngroups = SUNMIN(width, N);

  /* Loop over column groups. */
  for (group = 1; group <= ngroups; group++)
  {
    /* Increment all y_j in group */
    for (j = group - 1; j < N; j += width)
    {
      inc = SUNMAX(srur * SUNRabs(y_data[j]), minInc / ewt_data[j]);

      /* Adjust sign(inc) if yj has an inequality constraint. */
      if (cv_mem->cv_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((ytemp_data[j] + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((ytemp_data[j] + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      ytemp_data[j] += inc;
    }

    /* Evaluate f with incremented y */
    retval = cv_mem->cv_f(t, ytemp, ftemp, cv_mem->cv_user_data);
    cvls_mem->nfeDQ++;
    if (retval != 0) { break; }

    /* Restore ytemp, then form and load difference quotients */
    for (j = group - 1; j < N; j += width)
    {
      ytemp_data[j] = y_data[j];
      col_j         = SUNBandMatrix_Column(Jac, j);
      inc           = SUNMAX(srur * SUNRabs(y_data[j]), minInc / ewt_data[j]);

      /* Adjust sign(inc) as before. */
      if (cv_mem->cv_constraintsSet)
      {
        conj = cns_data[j];
        if (SUNRabs(conj) == ONE)
        {
          if ((ytemp_data[j] + inc) * conj < ZERO) { inc = -inc; }
        }
        else if (SUNRabs(conj) == TWO)
        {
          if ((ytemp_data[j] + inc) * conj <= ZERO) { inc = -inc; }
        }
      }

      inc_inv = ONE / inc;
      i1      = SUNMAX(0, j - mupper);
      i2      = SUNMIN(j + mlower, N - 1);
      for (i = i1; i <= i2; i++)
      {
        SM_COLUMN_ELEMENT_B(col_j, i, j) = inc_inv * (ftemp_data[i] - fy_data[i]);
      }
    }
  }

  return (retval);
}